

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,StoreExpr *expr)

{
  Module *pMVar1;
  Memory *memory_00;
  Enum EVar2;
  Index IVar3;
  const_reference ppMVar4;
  Newline local_b9;
  Type local_b8;
  StackVar local_b0;
  Type local_a4;
  StackVar local_9c;
  ExternalInstancePtr local_90;
  string local_80;
  string local_60;
  Memory *local_40;
  Memory *memory;
  string func;
  StoreExpr *expr_local;
  CWriter *this_local;
  
  func.field_2._8_8_ = expr;
  std::__cxx11::string::string((string *)&memory);
  EVar2 = Opcode::operator_cast_to_Enum((Opcode *)(func.field_2._8_8_ + 0x88));
  if (EVar2 == I32Store) {
    std::__cxx11::string::operator=((string *)&memory,"i32_store");
  }
  else if (EVar2 == I64Store) {
    std::__cxx11::string::operator=((string *)&memory,"i64_store");
  }
  else if (EVar2 == F32Store) {
    std::__cxx11::string::operator=((string *)&memory,"f32_store");
  }
  else if (EVar2 == F64Store) {
    std::__cxx11::string::operator=((string *)&memory,"f64_store");
  }
  else if (EVar2 == I32Store8) {
    std::__cxx11::string::operator=((string *)&memory,"i32_store8");
  }
  else if (EVar2 == I32Store16) {
    std::__cxx11::string::operator=((string *)&memory,"i32_store16");
  }
  else if (EVar2 == I64Store8) {
    std::__cxx11::string::operator=((string *)&memory,"i64_store8");
  }
  else if (EVar2 == I64Store16) {
    std::__cxx11::string::operator=((string *)&memory,"i64_store16");
  }
  else if (EVar2 == I64Store32) {
    std::__cxx11::string::operator=((string *)&memory,"i64_store32");
  }
  else {
    if (EVar2 != V128Store) {
      abort();
    }
    std::__cxx11::string::operator=((string *)&memory,"v128_store");
  }
  pMVar1 = this->module_;
  IVar3 = Module::GetMemoryIndex(this->module_,(Var *)(func.field_2._8_8_ + 0x40));
  ppMVar4 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                      (&pMVar1->memories,(ulong)IVar3);
  memory_00 = *ppMVar4;
  local_40 = memory_00;
  std::__cxx11::string::string((string *)&local_80,(string *)&memory);
  GetMemoryAPIString(&local_60,memory_00,&local_80);
  std::__cxx11::string::operator=((string *)&memory,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  ExternalInstancePtr::GlobalName(&local_90,Memory,&local_40->name);
  Type::Type(&local_a4,Any);
  StackVar::StackVar(&local_9c,1,local_a4);
  (anonymous_namespace)::CWriter::
  Write<std::__cxx11::string&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            ((CWriter *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&memory,
             (char (*) [2])0x37d6a1,&local_90,(char (*) [9])", (u64)(",&local_9c,
             (char (*) [2])0x371d65);
  if (*(long *)(func.field_2._8_8_ + 0x98) != 0) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[4],unsigned_long_const&>
              ((CWriter *)this,(char (*) [4])" + ",(unsigned_long *)(func.field_2._8_8_ + 0x98));
  }
  Type::Type(&local_b8,Any);
  StackVar::StackVar(&local_b0,0,local_b8);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x37f5cf,&local_b0,(char (*) [3])0x37d78e,&local_b9);
  DropTypes(this,2);
  std::__cxx11::string::~string((string *)&memory);
  return;
}

Assistant:

void CWriter::Write(const StoreExpr& expr) {
  std::string func;
  // clang-format off
  switch (expr.opcode) {
    case Opcode::I32Store: func = "i32_store"; break;
    case Opcode::I64Store: func = "i64_store"; break;
    case Opcode::F32Store: func = "f32_store"; break;
    case Opcode::F64Store: func = "f64_store"; break;
    case Opcode::I32Store8: func = "i32_store8"; break;
    case Opcode::I64Store8: func = "i64_store8"; break;
    case Opcode::I32Store16: func = "i32_store16"; break;
    case Opcode::I64Store16: func = "i64_store16"; break;
    case Opcode::I64Store32: func = "i64_store32"; break;
    case Opcode::V128Store: func = "v128_store"; break;

    default:
      WABT_UNREACHABLE;
  }
  // clang-format on

  Memory* memory = module_->memories[module_->GetMemoryIndex(expr.memidx)];
  func = GetMemoryAPIString(*memory, func);

  Write(func, "(", ExternalInstancePtr(ModuleFieldType::Memory, memory->name),
        ", (u64)(", StackVar(1), ")");
  if (expr.offset != 0)
    Write(" + ", expr.offset);
  Write(", ", StackVar(0), ");", Newline());
  DropTypes(2);
}